

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O3

int pcap_datalink_name_to_val(char *name)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  dlt_choice *pdVar4;
  long lVar5;
  
  pcVar3 = "DLT_NULL";
  lVar2 = 0;
  pdVar4 = dlt_choices;
  do {
    lVar5 = 0;
    while (lVar1 = lVar5 + 4, ""[(byte)pcVar3[lVar1]] == ""[(byte)name[lVar5]]) {
      lVar5 = lVar5 + 1;
      if (pcVar3[lVar1] == 0) {
        return pdVar4->dlt;
      }
    }
    lVar2 = lVar2 + 1;
    pdVar4 = dlt_choices + lVar2;
    pcVar3 = pdVar4->name;
  } while (pcVar3 != (char *)0x0);
  return -1;
}

Assistant:

int
pcap_datalink_name_to_val(const char *name)
{
	int i;

	for (i = 0; dlt_choices[i].name != NULL; i++) {
		if (pcap_strcasecmp(dlt_choices[i].name + sizeof("DLT_") - 1,
		    name) == 0)
			return (dlt_choices[i].dlt);
	}
	return (-1);
}